

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O0

vector<char,_std::allocator<char>_> * cpsm::decode<cpsm::SimpleStringTraits>(string_ref str)

{
  string_ref str_00;
  size_t in_RDX;
  char *in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  vector<char,_std::allocator<char>_> *vec;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x168f39);
  str_00.len_ = in_RDX;
  str_00.ptr_ = in_RSI;
  decode_to<cpsm::SimpleStringTraits>(str_00,in_stack_ffffffffffffffc0);
  return in_RDI;
}

Assistant:

std::vector<typename StringTraits::Char> decode(boost::string_ref const str) {
  std::vector<typename StringTraits::Char> vec;
  decode_to<StringTraits>(str, vec);
  return vec;
}